

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisReadDisplacement(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 size)

{
  byte bVar1;
  ZyanU8 *pZVar2;
  ulong uVar3;
  bool bVar4;
  ZyanStatus ZVar5;
  uint uVar6;
  long lVar7;
  ZyanUSize ZVar8;
  
  if ((instruction->raw).disp.size != '\0') {
    __assert_fail("instruction->raw.disp.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2db,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  (instruction->raw).disp.size = size;
  bVar1 = instruction->length;
  (instruction->raw).disp.offset = bVar1;
  uVar6 = (uint)size << 0x1d | size - 8 >> 3;
  if (7 < uVar6) {
switchD_00115531_caseD_2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2ff,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  lVar7 = (long)&switchD_00115531::switchdataD_00126758 +
          (long)(int)(&switchD_00115531::switchdataD_00126758)[uVar6];
  switch(uVar6) {
  case 0:
    if (bVar1 < 0xf) {
      ZVar8 = state->buffer_len;
      if (ZVar8 != 0) {
        pZVar2 = state->buffer;
        state->buffer = pZVar2 + 1;
        lVar7 = (long)(char)*pZVar2;
        instruction->length = bVar1 + 1;
        ZVar8 = ZVar8 - 1;
        break;
      }
LAB_001155bb:
      ZVar5 = 0x80200000;
    }
    else {
LAB_00115597:
      ZVar5 = 0x80200002;
    }
    lVar7 = 0;
    bVar4 = false;
    goto LAB_00115613;
  case 1:
    if (0xd < bVar1) goto LAB_00115597;
    uVar3 = state->buffer_len;
    if (uVar3 < 2) goto LAB_001155bb;
    instruction->length = bVar1 + 2;
    lVar7 = (long)*(short *)state->buffer;
    state->buffer = (ZyanU8 *)((long)state->buffer + 2);
    ZVar8 = uVar3 - 2;
    break;
  default:
    goto switchD_00115531_caseD_2;
  case 3:
    if (0xb < bVar1) goto LAB_00115597;
    uVar3 = state->buffer_len;
    if (uVar3 < 4) goto LAB_001155bb;
    instruction->length = bVar1 + 4;
    lVar7 = (long)*(int *)state->buffer;
    state->buffer = (ZyanU8 *)((long)state->buffer + 4);
    ZVar8 = uVar3 - 4;
    break;
  case 7:
    if (bVar1 < 8) {
      uVar3 = state->buffer_len;
      if (uVar3 < 8) {
        ZVar5 = 0x80200000;
        goto LAB_001155ad;
      }
      instruction->length = bVar1 + 8;
      lVar7 = *(long *)state->buffer;
      state->buffer = (ZyanU8 *)((long)state->buffer + 8);
      state->buffer_len = uVar3 - 8;
      ZVar5 = 0x100000;
      bVar4 = true;
    }
    else {
      ZVar5 = 0x80200002;
LAB_001155ad:
      bVar4 = false;
    }
    if (!bVar4) {
      return ZVar5;
    }
    goto LAB_00115617;
  }
  state->buffer_len = ZVar8;
  ZVar5 = 0x100000;
  bVar4 = true;
LAB_00115613:
  if (bVar4) {
LAB_00115617:
    (instruction->raw).disp.value = lVar7;
    ZVar5 = 0x100000;
  }
  return ZVar5;
}

Assistant:

static ZyanStatus ZydisReadDisplacement(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 size)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->raw.disp.size == 0);

    instruction->raw.disp.size = size;
    instruction->raw.disp.offset = instruction->length;

    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        instruction->raw.disp.value = *(ZyanI8*)&value;
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        instruction->raw.disp.value = *(ZyanI16*)&value;
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        instruction->raw.disp.value = *(ZyanI32*)&value;
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        instruction->raw.disp.value = *(ZyanI64*)&value;
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}